

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_arg * __thiscall
fmt::v8::detail::specs_handler<wchar_t>::get_arg
          (format_arg *__return_storage_ptr__,specs_handler<wchar_t> *this,undefined8 param_3,
          int param_4)

{
  buffer_context<wchar_t> *this_00;
  uint uVar1;
  
  this_00 = this->context_;
  uVar1 = basic_format_parse_context<wchar_t,_fmt::v8::detail::error_handler>::next_arg_id
                    (this->parse_context_);
  get_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>,int>
            (__return_storage_ptr__,(detail *)this_00,
             (basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t>
              *)(ulong)uVar1,param_4);
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto get_arg(auto_id) -> format_arg {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }